

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtQuantizedBvh.cpp
# Opt level: O2

void __thiscall
cbtQuantizedBvh::walkStacklessTree
          (cbtQuantizedBvh *this,cbtNodeOverlapCallback *nodeCallback,cbtVector3 *aabbMin,
          cbtVector3 *aabbMax)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  cbtOptimizedBvhNode *aabbMin2;
  
  aabbMin2 = (this->m_contiguousNodes).m_data;
  iVar4 = 0;
  iVar3 = 0;
  do {
    if (this->m_curNodeIndex <= iVar3) {
      if (maxIterations < iVar4) {
        maxIterations = iVar4;
      }
      return;
    }
    bVar2 = TestAabbAgainstAabb2(aabbMin,aabbMax,&aabbMin2->m_aabbMinOrg,&aabbMin2->m_aabbMaxOrg);
    iVar1 = aabbMin2->m_escapeIndex;
    if ((long)iVar1 == -1 && bVar2) {
      (*nodeCallback->_vptr_cbtNodeOverlapCallback[2])
                (nodeCallback,(ulong)(uint)aabbMin2->m_subPart,
                 (ulong)(uint)aabbMin2->m_triangleIndex);
LAB_00ddda33:
      aabbMin2 = aabbMin2 + 1;
      iVar3 = iVar3 + 1;
    }
    else {
      if ((~bVar2 & iVar1 != -1) == 0) goto LAB_00ddda33;
      iVar3 = iVar3 + iVar1;
      aabbMin2 = aabbMin2 + iVar1;
    }
    iVar4 = iVar4 + 1;
  } while( true );
}

Assistant:

void cbtQuantizedBvh::walkStacklessTree(cbtNodeOverlapCallback* nodeCallback, const cbtVector3& aabbMin, const cbtVector3& aabbMax) const
{
	cbtAssert(!m_useQuantization);

	const cbtOptimizedBvhNode* rootNode = &m_contiguousNodes[0];
	int escapeIndex, curIndex = 0;
	int walkIterations = 0;
	bool isLeafNode;
	//PCK: unsigned instead of bool
	unsigned aabbOverlap;

	while (curIndex < m_curNodeIndex)
	{
		//catch bugs in tree data
		cbtAssert(walkIterations < m_curNodeIndex);

		walkIterations++;
		aabbOverlap = TestAabbAgainstAabb2(aabbMin, aabbMax, rootNode->m_aabbMinOrg, rootNode->m_aabbMaxOrg);
		isLeafNode = rootNode->m_escapeIndex == -1;

		//PCK: unsigned instead of bool
		if (isLeafNode && (aabbOverlap != 0))
		{
			nodeCallback->processNode(rootNode->m_subPart, rootNode->m_triangleIndex);
		}

		//PCK: unsigned instead of bool
		if ((aabbOverlap != 0) || isLeafNode)
		{
			rootNode++;
			curIndex++;
		}
		else
		{
			escapeIndex = rootNode->m_escapeIndex;
			rootNode += escapeIndex;
			curIndex += escapeIndex;
		}
	}
	if (maxIterations < walkIterations)
		maxIterations = walkIterations;
}